

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

bool __thiscall
cmQtAutoGenInitializer::AddGeneratedSource
          (cmQtAutoGenInitializer *this,string *filename,GenVarsT *genVars,bool prepend)

{
  bool bVar1;
  
  RegisterGeneratedSource(this,filename);
  cmGeneratorTarget::AddSource(this->Target,filename,prepend);
  bVar1 = AddToSourceGroup(this,filename,genVars->GenNameUpper);
  return bVar1;
}

Assistant:

bool cmQtAutoGenInitializer::AddGeneratedSource(std::string const& filename,
                                                GenVarsT const& genVars,
                                                bool prepend)
{
  // Register source at makefile
  this->RegisterGeneratedSource(filename);
  // Add source file to target
  this->Target->AddSource(filename, prepend);
  // Add source file to source group
  return this->AddToSourceGroup(filename, genVars.GenNameUpper);
}